

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Ladder_Web.cpp
# Opt level: O1

bool __thiscall RenX_Ladder_WebPlugin::initialize(RenX_Ladder_WebPlugin *this)

{
  undefined1 *puVar1;
  pointer pcVar2;
  Content *pCVar3;
  undefined8 uVar4;
  Content *pCVar5;
  pointer *__ptr;
  EVP_PKEY_CTX *ctx;
  undefined1 auVar6 [16];
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  content;
  Content *local_68;
  Content *local_60;
  Content *local_58;
  Content *local_50;
  Content *local_48;
  long *local_40 [2];
  long local_30 [2];
  
  puVar1 = &this->field_0x38;
  auVar6 = Jupiter::Config::get(puVar1,0xe,"LadderPageName",0,"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->ladder_page_name,0,(this->ladder_page_name)._M_string_length,auVar6._8_8_,
             auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0xe,"SearchPageName",6,"search");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->search_page_name,0,(this->search_page_name)._M_string_length,auVar6._8_8_,
             auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,0xf,"ProfilePageName",7,"profile");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->profile_page_name,0,(this->profile_page_name)._M_string_length,auVar6._8_8_,
             auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,8,"Hostname",0,"");
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->web_hostname,0,(this->web_hostname)._M_string_length,auVar6._8_8_,auVar6._0_8_);
  auVar6 = Jupiter::Config::get(puVar1,4,"Path",1,"/");
  ctx = (EVP_PKEY_CTX *)0x0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&this->web_path,0,(this->web_path)._M_string_length,auVar6._8_8_,auVar6._0_8_);
  init(this,ctx);
  uVar4 = getHTTPServer();
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->ladder_page_name)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + (this->ladder_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_40,handle_ladder_page_abi_cxx11_);
  local_68 = pCVar5;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  *(undefined8 *)(local_68 + 0x40) = 2;
  *(undefined8 *)(local_68 + 0x48) = 0x10f842;
  *(undefined8 *)(local_68 + 0x50) = 9;
  *(undefined8 *)(local_68 + 0x58) = 0x10f845;
  *(undefined4 *)(local_68 + 0x60) = 5;
  *(undefined4 *)(local_68 + 100) = 0;
  *(undefined4 *)(local_68 + 0x68) = 0x10f84f;
  *(undefined4 *)(local_68 + 0x6c) = 0;
  local_48 = local_68;
  local_68 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  if (local_48 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_48,local_48);
  }
  local_48 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->search_page_name)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + (this->search_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_40,handle_search_page_abi_cxx11_);
  local_60 = pCVar5;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pCVar3 = local_60;
  pCVar5 = local_68;
  local_60 = (Content *)0x0;
  local_68 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_68,pCVar5);
  }
  if (local_60 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_60,local_60);
  }
  *(undefined8 *)(local_68 + 0x40) = 2;
  *(undefined8 *)(local_68 + 0x48) = 0x10f842;
  *(undefined8 *)(local_68 + 0x50) = 9;
  *(undefined8 *)(local_68 + 0x58) = 0x10f845;
  *(undefined4 *)(local_68 + 0x60) = 5;
  *(undefined4 *)(local_68 + 100) = 0;
  *(undefined4 *)(local_68 + 0x68) = 0x10f84f;
  *(undefined4 *)(local_68 + 0x6c) = 0;
  local_50 = local_68;
  local_68 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  if (local_50 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_50,local_50);
  }
  local_50 = (Content *)0x0;
  pCVar5 = (Content *)operator_new(0x70);
  pcVar2 = (this->profile_page_name)._M_dataplus._M_p;
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar2,pcVar2 + (this->profile_page_name)._M_string_length);
  Jupiter::HTTP::Server::Content::Content(pCVar5,local_40,handle_profile_page_abi_cxx11_);
  local_60 = pCVar5;
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  pCVar3 = local_60;
  pCVar5 = local_68;
  local_60 = (Content *)0x0;
  local_68 = pCVar3;
  if (pCVar5 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_68,pCVar5);
  }
  if (local_60 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_60,local_60);
  }
  *(undefined8 *)(local_68 + 0x40) = 2;
  *(undefined8 *)(local_68 + 0x48) = 0x10f842;
  *(undefined8 *)(local_68 + 0x50) = 9;
  *(undefined8 *)(local_68 + 0x58) = 0x10f845;
  *(undefined4 *)(local_68 + 0x60) = 5;
  *(undefined4 *)(local_68 + 100) = 0;
  *(undefined4 *)(local_68 + 0x68) = 0x10f84f;
  *(undefined4 *)(local_68 + 0x6c) = 0;
  local_58 = local_68;
  local_68 = (Content *)0x0;
  Jupiter::HTTP::Server::hook
            (uVar4,(this->web_hostname)._M_string_length,(this->web_hostname)._M_dataplus._M_p,
             (this->web_path)._M_string_length,(this->web_path)._M_dataplus._M_p);
  if (local_58 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_58,local_58);
  }
  local_58 = (Content *)0x0;
  if (local_68 != (Content *)0x0) {
    std::default_delete<Jupiter::HTTP::Server::Content>::operator()
              ((default_delete<Jupiter::HTTP::Server::Content> *)&local_68,local_68);
  }
  return true;
}

Assistant:

bool RenX_Ladder_WebPlugin::initialize() {
	RenX_Ladder_WebPlugin::ladder_page_name = this->config.get("LadderPageName"sv, ""sv);
	RenX_Ladder_WebPlugin::search_page_name = this->config.get("SearchPageName"sv, "search"sv);
	RenX_Ladder_WebPlugin::profile_page_name = this->config.get("ProfilePageName"sv, "profile"sv);
	RenX_Ladder_WebPlugin::web_hostname = this->config.get("Hostname"sv, ""sv);
	RenX_Ladder_WebPlugin::web_path = this->config.get("Path"sv, "/"sv);

	this->init();

	/** Initialize content */
	Jupiter::HTTP::Server &server = getHTTPServer();

	std::unique_ptr<Jupiter::HTTP::Server::Content> content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::ladder_page_name, handle_ladder_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::search_page_name, handle_search_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	content = std::make_unique<Jupiter::HTTP::Server::Content>(RenX_Ladder_WebPlugin::profile_page_name, handle_profile_page);
	content->language = Jupiter::HTTP::Content::Language::ENGLISH;
	content->type = Jupiter::HTTP::Content::Type::Text::HTML;
	content->charset = Jupiter::HTTP::Content::Type::Text::Charset::UTF8;
	server.hook(RenX_Ladder_WebPlugin::web_hostname, RenX_Ladder_WebPlugin::web_path, std::move(content));

	return true;
}